

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultBuilder * __thiscall
Catch::ExpressionLhs<lsh::vector_const&>::
captureExpression<(Catch::Internal::Operator)0,lsh::vector>
          (ExpressionLhs<lsh::vector_const&> *this,vector *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  char *pcVar2;
  allocator local_89;
  string local_88 [32];
  vector local_68;
  vector local_38;
  vector *local_18;
  vector *rhs_local;
  ExpressionLhs<const_lsh::vector_&> *this_local;
  
  pRVar1 = *(ResultBuilder **)this;
  local_18 = rhs;
  rhs_local = (vector *)this;
  result = Internal::compare<(Catch::Internal::Operator)0,lsh::vector,lsh::vector>
                     (*(vector **)(this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  toString<lsh::vector>(&local_38);
  pRVar1 = ResultBuilder::setLhs(pRVar1,(string *)&local_38);
  toString<lsh::vector>(&local_68);
  pRVar1 = ResultBuilder::setRhs(pRVar1,(string *)&local_68);
  pcVar2 = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar2,&local_89);
  pRVar1 = ResultBuilder::setOp(pRVar1,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }